

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeIntlObject
               (DynamicObject *IntlObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *this;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  IntlEngineInterfaceExtensionObject *this_00;
  
  DeferredTypeHandlerBase::Convert(typeHandler,IntlObject,mode,2,0);
  pJVar1 = (((IntlObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this = (((((((pJVar1->super_JavascriptLibraryBase).IntlObject.ptr)->super_RecyclableObject).type.
            ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  BVar5 = ScriptContext::VerifyAlive(this,0,(ScriptContext *)0x0);
  if (BVar5 != 0) {
    pJVar2 = (((((pJVar1->super_JavascriptLibraryBase).IntlObject.ptr)->super_RecyclableObject).type
              .ptr)->javascriptLibrary).ptr;
    if ((pJVar2->super_JavascriptLibraryBase).engineInterfaceObject.ptr ==
        (EngineInterfaceObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x14eb,"(library->engineInterfaceObject != nullptr)",
                                  "library->engineInterfaceObject != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    this_00 = (IntlEngineInterfaceExtensionObject *)
              EngineInterfaceObject::GetEngineExtension
                        ((pJVar2->super_JavascriptLibraryBase).engineInterfaceObject.ptr,
                         EngineInterfaceExtensionKind_Intl);
    IntlEngineInterfaceExtensionObject::InjectIntlLibraryCode
              (this_00,this,(pJVar1->super_JavascriptLibraryBase).IntlObject.ptr,Intl);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeIntlObject(DynamicObject* IntlObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(IntlObject, mode,  /*initSlotCapacity*/ 2);

        auto intlInitializer = [&](IntlEngineInterfaceExtensionObject* intlExtension, ScriptContext * scriptContext, DynamicObject* intlObject) ->void
        {
            intlExtension->InjectIntlLibraryCode(scriptContext, intlObject, IntlInitializationType::Intl);
        };
        IntlObject->GetLibrary()->InitializeIntlForPrototypes(intlInitializer);

        return true;
    }